

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateModuleTypeInformation(ExpressionTranslateContext *ctx)

{
  TypeBase *pTVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  TypeBase **ppTVar5;
  uint *puVar6;
  ulong uVar7;
  uint i_1;
  uint uVar8;
  char *pcVar9;
  TypeStruct *typeStruct;
  uint *puVar10;
  uint i;
  uint uVar11;
  bool bVar12;
  
  PrintIndentedLine(ctx,"// Register types");
  uVar7 = 0;
  while( true ) {
    uVar8 = (uint)uVar7;
    if ((ctx->ctx->types).count <= uVar8) break;
    ppTVar5 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,uVar8);
    pTVar1 = *ppTVar5;
    if (pTVar1->isGeneric == true) {
      PrintIndentedLine(ctx,"__nullcTR[%d] = 0; // generic type \'%.*s\'",uVar7,
                        (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
      goto LAB_00152c1c;
    }
    PrintIndent(ctx);
    Print(ctx,"__nullcTR[%d] = __nullcRegisterType(",uVar7);
    Print(ctx,"%uu, ",(ulong)pTVar1->nameHash);
    Print(ctx,"\"%.*s\", ",(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
    Print(ctx,"%lld, ",pTVar1->size);
    switch(pTVar1->typeID) {
    case 0x10:
    case 0x11:
    case 0x19:
      uVar11 = 0;
      puVar10 = &pTVar1[1].typeID;
      while (lVar2 = *(long *)puVar10, lVar2 != 0) {
        uVar11 = uVar11 + (**(char **)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40) != '$');
        puVar10 = (uint *)(lVar2 + 0x18);
      }
      Print(ctx,"__nullcTR[0], ");
      Print(ctx,"%d, NULLC_CLASS, %d, 0);",(ulong)uVar11,(ulong)pTVar1->alignment);
      goto LAB_00152c14;
    case 0x12:
      Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
      uVar7 = (ulong)pTVar1->alignment;
      pcVar9 = "1, NULLC_POINTER, %d, 0);";
      break;
    case 0x13:
      Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
      Print(ctx,"%d, NULLC_ARRAY, %d, 0);",(ulong)pTVar1[1].typeID,(ulong)pTVar1->alignment);
      goto LAB_00152c14;
    case 0x14:
      Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(*(long *)&pTVar1[1].typeIndex + 0x28));
      uVar7 = (ulong)pTVar1->alignment;
      pcVar9 = "-1, NULLC_ARRAY, %d, 0);";
      break;
    case 0x15:
      Print(ctx,"__nullcTR[%d], ",(ulong)*(uint *)(pTVar1[1]._vptr_TypeBase + 5));
      uVar7 = (ulong)pTVar1->alignment;
      pcVar9 = "0, NULLC_FUNCTION, %d, 0);";
      break;
    default:
      Print(ctx,"__nullcTR[0], ");
      uVar7 = (ulong)pTVar1->alignment;
      pcVar9 = "0, NULLC_NONE, %d, 0);";
      break;
    case 0x18:
      uVar11 = 0;
      puVar10 = &pTVar1[1].typeID;
      while (lVar2 = *(long *)puVar10, lVar2 != 0) {
        uVar11 = uVar11 + (**(char **)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40) != '$');
        puVar10 = (uint *)(lVar2 + 0x18);
      }
      if (pTVar1[2].unsizedArrayType == (TypeUnsizedArray *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)((pTVar1[2].unsizedArrayType)->super_TypeStruct).super_TypeBase.typeIndex;
      }
      Print(ctx,"__nullcTR[%d], ",uVar7);
      Print(ctx,"%d, NULLC_CLASS, %d, ",(ulong)uVar11,(ulong)pTVar1->alignment);
      bVar12 = *(char *)((long)&pTVar1[3]._vptr_TypeBase + 2) == '\x01';
      if (bVar12) {
        Print(ctx,"NULLC_TYPE_FLAG_HAS_FINALIZER");
      }
      if (*(char *)&pTVar1[2].arrayTypes.tail == '\x01') {
        pcVar9 = "";
        if (bVar12) {
          pcVar9 = " | ";
        }
        Print(ctx,"%sNULLC_TYPE_FLAG_IS_EXTENDABLE",pcVar9);
        bVar12 = true;
      }
      if (*(char *)&pTVar1[3]._vptr_TypeBase == '\0') {
        pcVar9 = "";
        if (bVar12) {
          pcVar9 = " | ";
        }
        Print(ctx,"%sNULLC_TYPE_FLAG_FORWARD_DECLARATION",pcVar9);
      }
      else if (!bVar12) {
        Print(ctx,"0");
      }
      Print(ctx,");");
      goto LAB_00152c14;
    }
    Print(ctx,pcVar9,uVar7);
LAB_00152c14:
    PrintLine(ctx);
LAB_00152c1c:
    uVar7 = (ulong)(uVar8 + 1);
  }
  PrintLine(ctx);
  PrintIndentedLine(ctx,"// Register type members");
  uVar8 = 0;
  do {
    if ((ctx->ctx->types).count <= uVar8) {
      PrintLine(ctx);
      return;
    }
    ppTVar5 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->ctx->types,uVar8);
    pTVar1 = *ppTVar5;
    if ((pTVar1->isGeneric == false) && (uVar11 = pTVar1->typeID, uVar11 < 0x1a)) {
      if ((0x3130000U >> (uVar11 & 0x1f) & 1) == 0) {
        if (uVar11 != 0x15) goto LAB_00152e6a;
        PrintIndent(ctx);
        puVar10 = &pTVar1[1].typeID;
        uVar11 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)puVar10);
        Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",(ulong)uVar8,(ulong)uVar11);
        while (plVar4 = *(long **)puVar10, plVar4 != (long *)0x0) {
          Print(ctx,", __nullcTR[%d]",(ulong)*(uint *)(*plVar4 + 0x28));
          Print(ctx,", 0");
          Print(ctx,", \"\"");
          puVar10 = (uint *)(plVar4 + 1);
        }
        pcVar9 = "); // type \'%.*s\' arguments";
      }
      else {
        uVar11 = 0;
        puVar10 = &pTVar1[1].typeID;
        puVar6 = puVar10;
        while (lVar2 = *(long *)puVar6, lVar2 != 0) {
          uVar11 = uVar11 + (**(char **)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40) != '$');
          puVar6 = (uint *)(lVar2 + 0x18);
        }
        PrintIndent(ctx);
        Print(ctx,"__nullcRegisterMembers(__nullcTR[%d], %d",(ulong)uVar8,(ulong)uVar11);
        while (lVar2 = *(long *)puVar10, lVar2 != 0) {
          if (**(char **)(*(long *)(*(long *)(lVar2 + 8) + 0x28) + 0x40) != '$') {
            Print(ctx,", __nullcTR[%d]",
                  (ulong)*(uint *)(*(long *)(*(long *)(lVar2 + 8) + 0x20) + 0x28));
            Print(ctx,", %d",(ulong)*(uint *)(*(long *)(lVar2 + 8) + 0x3c));
            lVar3 = *(long *)(*(long *)(lVar2 + 8) + 0x28);
            Print(ctx,", \"%.*s\"",
                  (ulong)(uint)(*(int *)(lVar3 + 0x48) - (int)*(undefined8 *)(lVar3 + 0x40)));
          }
          puVar10 = (uint *)(lVar2 + 0x18);
        }
        pcVar9 = "); // type \'%.*s\' members";
      }
      Print(ctx,pcVar9,(ulong)(uint)(*(int *)&(pTVar1->name).end - (int)(pTVar1->name).begin));
      PrintLine(ctx);
    }
LAB_00152e6a:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void TranslateModuleTypeInformation(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Register types");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
		{
			PrintIndentedLine(ctx, "__nullcTR[%d] = 0; // generic type '%.*s'", i, FMT_ISTR(type->name));
			continue;
		}

		PrintIndent(ctx);
		Print(ctx, "__nullcTR[%d] = __nullcRegisterType(", i);
		Print(ctx, "%uu, ", type->nameHash);
		Print(ctx, "\"%.*s\", ", FMT_ISTR(type->name));
		Print(ctx, "%lld, ", type->size);

		if(TypeArray *typeArray = getType<TypeArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeArray->subType->typeIndex);
			Print(ctx, "%d, NULLC_ARRAY, %d, 0);", (unsigned)typeArray->length, typeArray->alignment);
		}
		else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeUnsizedArray->subType->typeIndex);
			Print(ctx, "-1, NULLC_ARRAY, %d, 0);", typeUnsizedArray->alignment);
		}
		else if(TypeRef *typeRef = getType<TypeRef>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeRef->subType->typeIndex);
			Print(ctx, "1, NULLC_POINTER, %d, 0);", typeRef->alignment);
		}
		else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			Print(ctx, "__nullcTR[%d], ", typeFunction->returnType->typeIndex);
			Print(ctx, "0, NULLC_FUNCTION, %d, 0);", typeFunction->alignment);
		}
		else if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[%d], ", typeClass->baseClass ? typeClass->baseClass->typeIndex : 0);
			Print(ctx, "%d, NULLC_CLASS, %d, ", count, typeClass->alignment);

			bool hasFlags = false;

			if(typeClass->hasFinalizer)
			{
				Print(ctx, "NULLC_TYPE_FLAG_HAS_FINALIZER");
				hasFlags = true;
			}

			if(typeClass->extendable)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_IS_EXTENDABLE", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!typeClass->completed)
			{
				Print(ctx, "%sNULLC_TYPE_FLAG_FORWARD_DECLARATION", hasFlags ? " | " : "");
				hasFlags = true;
			}

			if(!hasFlags)
				Print(ctx, "0");

			Print(ctx, ");");
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "%d, NULLC_CLASS, %d, 0);", count, typeStruct->alignment);
		}
		else
		{
			Print(ctx, "__nullcTR[0], ");
			Print(ctx, "0, NULLC_NONE, %d, 0);", type->alignment);
		}

		PrintLine(ctx);
	}

	PrintLine(ctx);

	PrintIndentedLine(ctx, "// Register type members");

	for(unsigned i = 0; i < ctx.ctx.types.size(); i++)
	{
		TypeBase *type = ctx.ctx.types[i];

		if(type->isGeneric)
			continue;

		if(TypeFunction *typeFunction = getType<TypeFunction>(type))
		{
			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, typeFunction->arguments.size());

			for(TypeHandle *curr = typeFunction->arguments.head; curr; curr = curr->next)
			{
				Print(ctx, ", __nullcTR[%d]", curr->type->typeIndex);
				Print(ctx, ", 0");
				Print(ctx, ", \"\"");
			}

			Print(ctx, "); // type '%.*s' arguments", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
		else if(TypeStruct *typeStruct = getType<TypeStruct>(type))
		{
			unsigned count = 0;

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				count++;
			}

			PrintIndent(ctx);
			Print(ctx, "__nullcRegisterMembers(__nullcTR[%d], %d", i, count);

			for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
			{
				if(*curr->variable->name->name.begin == '$')
					continue;

				Print(ctx, ", __nullcTR[%d]", curr->variable->type->typeIndex);
				Print(ctx, ", %d", curr->variable->offset);
				Print(ctx, ", \"%.*s\"", FMT_ISTR(curr->variable->name->name));
			}

			Print(ctx, "); // type '%.*s' members", FMT_ISTR(type->name));
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}